

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeRemoveWindow
               (ImGuiDockNode *node,ImGuiWindow_conflict *window,ImGuiID save_dock_id)

{
  ImVector_ImGuiWindowPtr *pIVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow_conflict **ppIVar4;
  ImGuiWindow_conflict *pIVar5;
  ImGuiViewportP_conflict1 *pIVar6;
  ImGuiContext_conflict1 *ctx;
  int iVar7;
  long lVar8;
  ulong uVar9;
  size_t __n;
  uint flags;
  ulong uVar10;
  ImGuiWindow **__dest;
  
  ctx = GImGui;
  if (window->DockNode != node) {
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3506,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  if ((save_dock_id != 0) && (node->ID != save_dock_id)) {
    __assert_fail("save_dock_id == 0 || save_dock_id == node->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3509,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  window->DockNode = (ImGuiDockNode *)0x0;
  window->field_0x3e1 = window->field_0x3e1 & 0xf6;
  window->DockId = save_dock_id;
  flags = window->Flags & 0xfeffffff;
  window->Flags = flags;
  pIVar2 = window->ParentWindow;
  if (pIVar2 != (ImGuiWindow_conflict *)0x0) {
    ppIVar3 = (pIVar2->DC).ChildWindows.Data;
    lVar8 = (long)(pIVar2->DC).ChildWindows.Size;
    __dest = ppIVar3;
    if (0 < lVar8) {
      do {
        if (*__dest == (ImGuiWindow *)window) break;
        __dest = __dest + 1;
      } while (__dest < ppIVar3 + lVar8);
    }
    if (__dest < ppIVar3 + lVar8) {
      if (__dest < ppIVar3) {
LAB_001de170:
        __assert_fail("it >= Data && it < Data + Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x71d,"T *ImVector<ImGuiWindow *>::erase(const T *) [T = ImGuiWindow *]");
      }
      memmove(__dest,__dest + 1,(((ulong)~((long)__dest - (long)ppIVar3) >> 3) + lVar8) * 8);
      pIVar1 = &(pIVar2->DC).ChildWindows;
      pIVar1->Size = pIVar1->Size + -1;
      flags = window->Flags;
    }
  }
  UpdateWindowParentAndRootLinks(window,flags,(ImGuiWindow_conflict *)0x0);
  uVar9 = (ulong)(node->Windows).Size;
  if (0 < (long)uVar9) {
    ppIVar4 = (node->Windows).Data;
    __n = uVar9 * 8 - 8;
    uVar10 = 0;
    do {
      if (ppIVar4[uVar10] == window) {
        if (uVar10 < uVar9) {
          memmove(ppIVar4 + uVar10,ppIVar4 + uVar10 + 1,__n);
          iVar7 = (node->Windows).Size + -1;
          (node->Windows).Size = iVar7;
          if (node->VisibleWindow == window) {
            node->VisibleWindow = (ImGuiWindow_conflict *)0x0;
          }
          node->field_0xbe = node->field_0xbe | 2;
          if (node->TabBar == (ImGuiTabBar *)0x0) {
LAB_001de0d4:
            if (iVar7 == 0) {
              if (((node->MergedFlags & 0xc00) == 0) && (window->DockId != node->ID)) {
                DockContextRemoveNode(ctx,node,true);
                return;
              }
              goto LAB_001de142;
            }
          }
          else {
            TabBarRemoveTab(node->TabBar,window->ID);
            iVar7 = (node->Windows).Size;
            if (iVar7 < (int)(((node->MergedFlags & 0x800) == 0) + 1)) {
              if (node->TabBar != (ImGuiTabBar *)0x0) {
                IM_DELETE<ImGuiTabBar>(node->TabBar);
                node->TabBar = (ImGuiTabBar *)0x0;
                iVar7 = (node->Windows).Size;
              }
              goto LAB_001de0d4;
            }
          }
          if (((iVar7 == 1) && ((node->MergedFlags & 0x800) == 0)) &&
             (pIVar2 = node->HostWindow, pIVar2 != (ImGuiWindow_conflict *)0x0)) {
            pIVar5 = *(node->Windows).Data;
            if ((pIVar2->ViewportOwned == true) && (node->ParentNode == (ImGuiDockNode *)0x0)) {
              pIVar6 = pIVar2->Viewport;
              if (pIVar6->Window != pIVar2) {
                __assert_fail("node->HostWindow->Viewport->Window == node->HostWindow",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                              ,0x353a,
                              "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)"
                             );
              }
              pIVar6->Window = pIVar5;
              (pIVar6->super_ImGuiViewport).ID = pIVar5->ID;
            }
            pIVar5->Collapsed = pIVar2->Collapsed;
          }
LAB_001de142:
          DockNodeUpdateVisibleFlag(node);
          return;
        }
        goto LAB_001de170;
      }
      uVar10 = uVar10 + 1;
      __n = __n - 8;
    } while (__n != 0xfffffffffffffff8);
  }
  __assert_fail("erased",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x351e,"void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)")
  ;
}

Assistant:

static void ImGui::DockNodeRemoveWindow(ImGuiDockNode* node, ImGuiWindow* window, ImGuiID save_dock_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window->DockNode == node);
    //IM_ASSERT(window->RootWindowDockTree == node->HostWindow);
    //IM_ASSERT(window->LastFrameActive < g.FrameCount);    // We may call this from Begin()
    IM_ASSERT(save_dock_id == 0 || save_dock_id == node->ID);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeRemoveWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    window->DockNode = NULL;
    window->DockIsActive = window->DockTabWantClose = false;
    window->DockId = save_dock_id;
    window->Flags &= ~ImGuiWindowFlags_ChildWindow;
    if (window->ParentWindow)
        window->ParentWindow->DC.ChildWindows.find_erase(window);
    UpdateWindowParentAndRootLinks(window, window->Flags, NULL); // Update immediately

    // Remove window
    bool erased = false;
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n] == window)
        {
            node->Windows.erase(node->Windows.Data + n);
            erased = true;
            break;
        }
    if (!erased)
        IM_ASSERT(erased);
    if (node->VisibleWindow == window)
        node->VisibleWindow = NULL;

    // Remove tab and possibly tab bar
    node->WantHiddenTabBarUpdate = true;
    if (node->TabBar)
    {
        TabBarRemoveTab(node->TabBar, window->ID);
        const int tab_count_threshold_for_tab_bar = node->IsCentralNode() ? 1 : 2;
        if (node->Windows.Size < tab_count_threshold_for_tab_bar)
            DockNodeRemoveTabBar(node);
    }

    if (node->Windows.Size == 0 && !node->IsCentralNode() && !node->IsDockSpace() && window->DockId != node->ID)
    {
        // Automatic dock node delete themselves if they are not holding at least one tab
        DockContextRemoveNode(&g, node, true);
        return;
    }

    if (node->Windows.Size == 1 && !node->IsCentralNode() && node->HostWindow)
    {
        ImGuiWindow* remaining_window = node->Windows[0];
        if (node->HostWindow->ViewportOwned && node->IsRootNode())
        {
            // Transfer viewport back to the remaining loose window
            IMGUI_DEBUG_LOG_VIEWPORT("Node %08X transfer Viewport %08X=>%08X for Window '%s'\n", node->ID, node->HostWindow->Viewport->ID, remaining_window->ID, remaining_window->Name);
            IM_ASSERT(node->HostWindow->Viewport->Window == node->HostWindow);
            node->HostWindow->Viewport->Window = remaining_window;
            node->HostWindow->Viewport->ID = remaining_window->ID;
        }
        remaining_window->Collapsed = node->HostWindow->Collapsed;
    }

    // Update visibility immediately is required so the DockNodeUpdateRemoveInactiveChilds() processing can reflect changes up the tree
    DockNodeUpdateVisibleFlag(node);
}